

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O2

void build_relative_branch(m68k_info *info,int opcode,int size,int displacement)

{
  byte bVar1;
  cs_m68k *pcVar2;
  
  pcVar2 = build_init_op(info,opcode,1,size);
  pcVar2->operands[0].type = M68K_OP_BR_DISP;
  pcVar2->operands[0].address_mode = M68K_AM_BRANCH_DISPLACEMENT;
  pcVar2->operands[0].br_disp.disp = displacement;
  pcVar2->operands[0].br_disp.disp_size = (uint8_t)size;
  bVar1 = info->groups_count;
  info->groups_count = bVar1 + 1;
  info->groups[bVar1] = '\x01';
  bVar1 = info->groups_count;
  info->groups_count = bVar1 + 1;
  info->groups[bVar1] = '\a';
  return;
}

Assistant:

static void build_relative_branch(m68k_info *info, int opcode, int size, int displacement)
{
	cs_m68k_op* op;
	cs_m68k* ext = build_init_op(info, opcode, 1, size);

	op = &ext->operands[0];

	op->type = M68K_OP_BR_DISP;
	op->address_mode = M68K_AM_BRANCH_DISPLACEMENT;
	op->br_disp.disp = displacement;
	op->br_disp.disp_size = size;

	set_insn_group(info, M68K_GRP_JUMP);
	set_insn_group(info, M68K_GRP_BRANCH_RELATIVE);
}